

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::xpath_ast_node::
     compare_rel<pugi::impl::(anonymous_namespace)::less>
               (xpath_ast_node *lhs,xpath_ast_node *rhs,xpath_context *c,xpath_stack *stack,
               less *comp)

{
  bool *pbVar1;
  less *plVar2;
  xpath_node *pxVar3;
  char_t *pcVar4;
  xpath_string local_268;
  double local_250;
  undefined1 local_248 [8];
  xpath_allocator_capture cri_2;
  xpath_node *li_1;
  double r;
  xpath_node_set_raw ls_1;
  xpath_allocator_capture cr_2;
  double local_1c0;
  undefined1 local_1b8 [8];
  xpath_allocator_capture cri_1;
  xpath_node *ri_1;
  xpath_node_set_raw rs_1;
  double l_1;
  xpath_allocator_capture cr_1;
  xpath_string local_140;
  double local_128;
  undefined1 local_120 [8];
  xpath_allocator_capture crii;
  xpath_node *ri;
  double local_e0;
  double l;
  xpath_allocator_capture cri;
  xpath_node *li;
  xpath_node_set_raw rs;
  xpath_node_set_raw ls;
  xpath_allocator_capture cr;
  double local_48;
  xpath_value_type local_40;
  xpath_value_type local_3c;
  xpath_value_type rt;
  xpath_value_type lt;
  less *comp_local;
  xpath_stack *stack_local;
  xpath_context *c_local;
  xpath_ast_node *rhs_local;
  xpath_ast_node *lhs_local;
  
  _rt = comp;
  comp_local = (less *)stack;
  stack_local = (xpath_stack *)c;
  c_local = (xpath_context *)rhs;
  rhs_local = lhs;
  local_3c = rettype(lhs);
  local_40 = rettype((xpath_ast_node *)c_local);
  plVar2 = _rt;
  if ((local_3c == xpath_type_node_set) || (local_40 == xpath_type_node_set)) {
    if ((local_3c == xpath_type_node_set) && (local_40 == xpath_type_node_set)) {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&ls._eos,*(xpath_allocator **)comp_local);
      eval_node_set((xpath_node_set_raw *)&rs._eos,rhs_local,(xpath_context *)stack_local,
                    (xpath_stack *)comp_local,nodeset_eval_all);
      eval_node_set((xpath_node_set_raw *)&li,(xpath_ast_node *)c_local,(xpath_context *)stack_local
                    ,(xpath_stack *)comp_local,nodeset_eval_all);
      for (cri._state._error = (bool *)xpath_node_set_raw::begin((xpath_node_set_raw *)&rs._eos);
          pbVar1 = cri._state._error,
          pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&rs._eos),
          (xpath_node *)pbVar1 != pxVar3; cri._state._error = cri._state._error + 0x10) {
        xpath_allocator_capture::xpath_allocator_capture
                  ((xpath_allocator_capture *)&l,*(xpath_allocator **)comp_local);
        string_value((xpath_string *)&ri,(xpath_node *)cri._state._error,
                     *(xpath_allocator **)comp_local);
        pcVar4 = xpath_string::c_str((xpath_string *)&ri);
        local_e0 = convert_string_to_number(pcVar4);
        for (crii._state._error = (bool *)xpath_node_set_raw::begin((xpath_node_set_raw *)&li);
            pbVar1 = crii._state._error, pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&li)
            , (xpath_node *)pbVar1 != pxVar3; crii._state._error = crii._state._error + 0x10) {
          xpath_allocator_capture::xpath_allocator_capture
                    ((xpath_allocator_capture *)local_120,*(xpath_allocator **)comp_local);
          plVar2 = _rt;
          string_value(&local_140,(xpath_node *)crii._state._error,*(xpath_allocator **)comp_local);
          pcVar4 = xpath_string::c_str(&local_140);
          local_128 = convert_string_to_number(pcVar4);
          cr_1._state._error._4_1_ =
               (anonymous_namespace)::less::operator()(plVar2,&local_e0,&local_128);
          if (cr_1._state._error._4_1_) {
            lhs_local._7_1_ = 1;
          }
          cr_1._state._error._5_3_ = 0;
          xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_120);
          if (cr_1._state._error._4_4_ != 0) goto LAB_005100f4;
        }
        cr_1._state._error._4_4_ = 0;
LAB_005100f4:
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&l);
        if (cr_1._state._error._4_4_ != 0) goto LAB_00510133;
      }
      lhs_local._7_1_ = 0;
      cr_1._state._error._4_4_ = 1;
LAB_00510133:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ls._eos);
    }
    else if ((local_3c == xpath_type_node_set) || (local_40 != xpath_type_node_set)) {
      if ((local_3c != xpath_type_node_set) || (local_40 == xpath_type_node_set)) {
        __assert_fail("false && \"Wrong types\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x26a5,
                      "static bool pugi::impl::(anonymous namespace)::xpath_ast_node::compare_rel(xpath_ast_node *, xpath_ast_node *, const xpath_context &, const xpath_stack &, const Comp &) [Comp = pugi::impl::(anonymous namespace)::less]"
                     );
      }
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&ls_1._eos,*(xpath_allocator **)comp_local);
      eval_node_set((xpath_node_set_raw *)&r,rhs_local,(xpath_context *)stack_local,
                    (xpath_stack *)comp_local,nodeset_eval_all);
      li_1 = (xpath_node *)
             eval_number((xpath_ast_node *)c_local,(xpath_context *)stack_local,
                         (xpath_stack *)comp_local);
      for (cri_2._state._error = (bool *)xpath_node_set_raw::begin((xpath_node_set_raw *)&r);
          pbVar1 = cri_2._state._error, pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&r),
          (xpath_node *)pbVar1 != pxVar3; cri_2._state._error = cri_2._state._error + 0x10) {
        xpath_allocator_capture::xpath_allocator_capture
                  ((xpath_allocator_capture *)local_248,*(xpath_allocator **)comp_local);
        plVar2 = _rt;
        string_value(&local_268,(xpath_node *)cri_2._state._error,*(xpath_allocator **)comp_local);
        pcVar4 = xpath_string::c_str(&local_268);
        local_250 = convert_string_to_number(pcVar4);
        cr_1._state._error._4_1_ =
             (anonymous_namespace)::less::operator()(plVar2,&local_250,(double *)&li_1);
        if (cr_1._state._error._4_1_) {
          lhs_local._7_1_ = 1;
        }
        cr_1._state._error._5_3_ = 0;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_248);
        if (cr_1._state._error._4_4_ != 0) goto LAB_00510422;
      }
      lhs_local._7_1_ = 0;
      cr_1._state._error._4_4_ = 1;
LAB_00510422:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&ls_1._eos);
    }
    else {
      xpath_allocator_capture::xpath_allocator_capture
                ((xpath_allocator_capture *)&l_1,*(xpath_allocator **)comp_local);
      rs_1._eos = (xpath_node *)
                  eval_number(rhs_local,(xpath_context *)stack_local,(xpath_stack *)comp_local);
      eval_node_set((xpath_node_set_raw *)&ri_1,(xpath_ast_node *)c_local,
                    (xpath_context *)stack_local,(xpath_stack *)comp_local,nodeset_eval_all);
      for (cri_1._state._error = (bool *)xpath_node_set_raw::begin((xpath_node_set_raw *)&ri_1);
          pbVar1 = cri_1._state._error,
          pxVar3 = xpath_node_set_raw::end((xpath_node_set_raw *)&ri_1),
          (xpath_node *)pbVar1 != pxVar3; cri_1._state._error = cri_1._state._error + 0x10) {
        xpath_allocator_capture::xpath_allocator_capture
                  ((xpath_allocator_capture *)local_1b8,*(xpath_allocator **)comp_local);
        plVar2 = _rt;
        string_value((xpath_string *)&cr_2._state._error,(xpath_node *)cri_1._state._error,
                     *(xpath_allocator **)comp_local);
        pcVar4 = xpath_string::c_str((xpath_string *)&cr_2._state._error);
        local_1c0 = convert_string_to_number(pcVar4);
        cr_1._state._error._4_1_ =
             (anonymous_namespace)::less::operator()(plVar2,(double *)&rs_1._eos,&local_1c0);
        if (cr_1._state._error._4_1_) {
          lhs_local._7_1_ = 1;
        }
        cr_1._state._error._5_3_ = 0;
        xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)local_1b8);
        if (cr_1._state._error._4_4_ != 0) goto LAB_005102a9;
      }
      lhs_local._7_1_ = 0;
      cr_1._state._error._4_4_ = 1;
LAB_005102a9:
      xpath_allocator_capture::~xpath_allocator_capture((xpath_allocator_capture *)&l_1);
    }
  }
  else {
    local_48 = eval_number(rhs_local,(xpath_context *)stack_local,(xpath_stack *)comp_local);
    cr._state._error =
         (bool *)eval_number((xpath_ast_node *)c_local,(xpath_context *)stack_local,
                             (xpath_stack *)comp_local);
    lhs_local._7_1_ =
         (anonymous_namespace)::less::operator()(plVar2,&local_48,(double *)&cr._state._error);
  }
  return (bool)(lhs_local._7_1_ & 1);
}

Assistant:

static bool compare_rel(xpath_ast_node* lhs, xpath_ast_node* rhs, const xpath_context& c, const xpath_stack& stack, const Comp& comp)
		{
			xpath_value_type lt = lhs->rettype(), rt = rhs->rettype();

			if (lt != xpath_type_node_set && rt != xpath_type_node_set)
				return comp(lhs->eval_number(c, stack), rhs->eval_number(c, stack));
			else if (lt == xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					double l = convert_string_to_number(string_value(*li, stack.result).c_str());

					for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
					{
						xpath_allocator_capture crii(stack.result);

						if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
							return true;
					}
				}

				return false;
			}
			else if (lt != xpath_type_node_set && rt == xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				double l = lhs->eval_number(c, stack);
				xpath_node_set_raw rs = rhs->eval_node_set(c, stack, nodeset_eval_all);

				for (const xpath_node* ri = rs.begin(); ri != rs.end(); ++ri)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(l, convert_string_to_number(string_value(*ri, stack.result).c_str())))
						return true;
				}

				return false;
			}
			else if (lt == xpath_type_node_set && rt != xpath_type_node_set)
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ls = lhs->eval_node_set(c, stack, nodeset_eval_all);
				double r = rhs->eval_number(c, stack);

				for (const xpath_node* li = ls.begin(); li != ls.end(); ++li)
				{
					xpath_allocator_capture cri(stack.result);

					if (comp(convert_string_to_number(string_value(*li, stack.result).c_str()), r))
						return true;
				}

				return false;
			}
			else
			{
				assert(false && "Wrong types"); // unreachable
				return false;
			}
		}